

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_guardcc(ASMState *as,int cc)

{
  MCLabel target_00;
  uint in_ESI;
  ASMState *in_RDI;
  MCode *p;
  MCode *target;
  ptrdiff_t delta;
  MCode *local_40;
  uint local_34;
  
  local_40 = in_RDI->J->exitstubgroup[in_RDI->snapno >> 5] + ((in_RDI->snapno & 0x1f) << 2);
  target_00 = in_RDI->mcp;
  local_34 = in_ESI;
  if (target_00 == in_RDI->invmcp) {
    in_RDI->loopinv = 1;
    *(int *)(target_00 + 1) = (int)local_40 - ((int)target_00 + 5);
    local_34 = in_ESI ^ 1;
    local_40 = target_00;
    if (in_RDI->realign != (MCode *)0x0) {
      emit_sjcc(in_RDI,local_34,target_00);
      return;
    }
  }
  emit_jcc(in_RDI,local_34,local_40);
  return;
}

Assistant:

static void asm_guardcc(ASMState *as, int cc)
{
  MCode *target = exitstub_addr(as->J, as->snapno);
  MCode *p = as->mcp;
  if (LJ_UNLIKELY(p == as->invmcp)) {
    as->loopinv = 1;
    *(int32_t *)(p+1) = jmprel(p+5, target);
    target = p;
    cc ^= 1;
    if (as->realign) {
      emit_sjcc(as, cc, target);
      return;
    }
  }
  emit_jcc(as, cc, target);
}